

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

void custom_flags_example(void)

{
  pattern_formatter *this;
  pointer *__ptr;
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> formatter;
  pattern_formatter *local_38;
  string local_30;
  
  spdlog::details::make_unique<spdlog::pattern_formatter>();
  this = spdlog::pattern_formatter::add_flag<my_formatter_flag>(local_38,'*');
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"[%n] [%*] [%^%l%$] %v","");
  spdlog::pattern_formatter::set_pattern(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_38 != (pattern_formatter *)0x0) {
    std::default_delete<spdlog::pattern_formatter>::operator()
              ((default_delete<spdlog::pattern_formatter> *)&local_38,local_38);
  }
  return;
}

Assistant:

void custom_flags_example() {
    using spdlog::details::make_unique;  // for pre c++14
    auto formatter = make_unique<spdlog::pattern_formatter>();
    formatter->add_flag<my_formatter_flag>('*').set_pattern("[%n] [%*] [%^%l%$] %v");
    // set the new formatter using spdlog::set_formatter(formatter) or
    // logger->set_formatter(formatter) spdlog::set_formatter(std::move(formatter));
}